

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueAsKFLOAT64
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,VariableDatum *this)

{
  KBOOL KVar1;
  bool bVar2;
  pointer O;
  double dVar3;
  NetToDataType<double> local_48 [12];
  int local_3c;
  int local_38;
  KUINT32 ui32LengthInOctets;
  KUINT32 ui32CurrentPos;
  const_iterator citrEnd;
  const_iterator citr;
  KBOOL bSwapBytes;
  VariableDatum *this_local;
  vector<double,_std::allocator<double>_> *m_Return;
  
  KVar1 = UTILS::IsMachineBigEndian();
  citrEnd = std::
            vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
            ::begin(&this->m_v8DatumValue);
  _ui32CurrentPos =
       std::
       vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
       ::end(&this->m_v8DatumValue);
  ui32LengthInOctets._3_1_ = 0;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  local_38 = 0;
  dVar3 = ceil((double)this->m_ui32DatumLength * 0.125);
  local_3c = (int)(long)dVar3;
  while ((bVar2 = __gnu_cxx::operator!=
                            (&citrEnd,(__normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
                                       *)&ui32CurrentPos), bVar2 &&
         (7 < (uint)(local_3c - local_38)))) {
    O = __gnu_cxx::
        __normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
        ::operator->(&citrEnd);
    NetToDataType<double>::NetToDataType(local_48,O->Buffer,!KVar1);
    std::vector<double,_std::allocator<double>_>::push_back
              (__return_storage_ptr__,(value_type_conflict5 *)local_48);
    local_38 = local_38 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<KFLOAT64> VariableDatum::GetDatumValueAsKFLOAT64() const
{
    KBOOL bSwapBytes = !IsMachineBigEndian();

    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    vector<KFLOAT64> m_Return;

    KUINT32 ui32CurrentPos = 0;
    KUINT32 ui32LengthInOctets = ceil(m_ui32DatumLength / 8.0);

    while( citr != citrEnd )
    {
        if( ( ui32LengthInOctets - ui32CurrentPos ) < 8 )break;

        m_Return.push_back( NetToKFLOAT64( citr->Buffer, bSwapBytes ).m_Value );

        ui32CurrentPos += 8;
    }

    return m_Return;
}